

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O3

uint64_t helper_float_cvtpw_ps_mipsel(CPUMIPSState_conflict4 *env,uint64_t fdt0)

{
  float_status *s;
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  uintptr_t unaff_retaddr;
  
  s = &(env->active_fpu).fp_status;
  uVar4 = float32_to_int32_mipsel((float32)fdt0,s);
  bVar1 = (env->active_fpu).fp_status.float_exception_flags;
  (env->active_fpu).fp_status.float_exception_flags = '\0';
  uVar5 = float32_to_int32_mipsel((float32)(fdt0 >> 0x20),s);
  bVar2 = (env->active_fpu).fp_status.float_exception_flags;
  bVar8 = bVar2 | bVar1;
  (env->active_fpu).fp_status.float_exception_flags = bVar8;
  if (bVar8 == 0) {
    uVar9 = 0;
  }
  else {
    uVar9 = bVar8 >> 5 & 1 | (bVar8 >> 3 & 2 | bVar8 >> 1 & 4 | (bVar8 & 1) << 4) + (bVar8 & 4) * 2;
  }
  uVar3 = (env->active_fpu).fcr31;
  uVar10 = uVar9 << 0xc | uVar3 & 0xfffc0fff;
  (env->active_fpu).fcr31 = uVar10;
  if (uVar9 != 0) {
    (env->active_fpu).fp_status.float_exception_flags = '\0';
    if ((uVar3 >> 7 & uVar9) != 0) {
      do_raise_exception(env,0x17,unaff_retaddr);
    }
    (env->active_fpu).fcr31 = uVar10 | uVar9 << 2;
  }
  uVar7 = 0x7fffffff00000000;
  if ((bVar2 & 9) == 0) {
    uVar7 = (ulong)uVar5 << 0x20;
  }
  uVar6 = 0x7fffffff;
  if ((bVar1 & 9) == 0) {
    uVar6 = (ulong)uVar4;
  }
  return uVar6 | uVar7;
}

Assistant:

uint64_t helper_float_cvtpw_ps(CPUMIPSState *env, uint64_t fdt0)
{
    uint32_t wt2;
    uint32_t wth2;
    int excp, excph;

    wt2 = float32_to_int32(fdt0 & 0XFFFFFFFF, &env->active_fpu.fp_status);
    excp = get_float_exception_flags(&env->active_fpu.fp_status);
    if (excp & (float_flag_overflow | float_flag_invalid)) {
        wt2 = FP_TO_INT32_OVERFLOW;
    }

    set_float_exception_flags(0, &env->active_fpu.fp_status);
    wth2 = float32_to_int32(fdt0 >> 32, &env->active_fpu.fp_status);
    excph = get_float_exception_flags(&env->active_fpu.fp_status);
    if (excph & (float_flag_overflow | float_flag_invalid)) {
        wth2 = FP_TO_INT32_OVERFLOW;
    }

    set_float_exception_flags(excp | excph, &env->active_fpu.fp_status);
    update_fcr31(env, GETPC());

    return ((uint64_t)wth2 << 32) | wt2;
}